

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O1

void libcmepoll_LTX_select_free(CMtrans_services_conflict svc,CManager cm,void *client_data)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  
  (*svc->verbose)(*(CManager *)(*client_data + 0x30),CMFreeVerbose,"CMSelect free task called");
  pvVar1 = *client_data;
  if (pvVar1 == (void *)0x0) {
    return;
  }
  *(undefined8 *)client_data = 0;
  pvVar2 = *(void **)((long)pvVar1 + 0x20);
  (*svc->free_func)(*(void **)((long)pvVar1 + 0x10));
  (*svc->free_func)(*(void **)((long)pvVar1 + 0x18));
  while (pvVar2 != (void *)0x0) {
    pvVar3 = *(void **)((long)pvVar2 + 0x38);
    (*svc->free_func)(pvVar2);
    pvVar2 = pvVar3;
  }
  (*svc->free_func)(pvVar1);
  return;
}

Assistant:

extern void
libcmepoll_LTX_select_free(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMFreeVerbose, "CMSelect free task called");

    if (*((select_data_ptr *)client_data) != NULL) {
	free_epoll_data(svc, sdp);
    }
}